

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

mat4 * rengine::TransformNode::matrixFor(mat4 *__return_storage_ptr__,Node *descendant,Node *root)

{
  mat4 o;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  mat4 local_b0;
  mat4 local_6c;
  TransformNode *local_28;
  TransformNode *tn;
  Node *n;
  Node *root_local;
  Node *descendant_local;
  
  tn = (TransformNode *)descendant;
  n = root;
  root_local = descendant;
  mat4::mat4(__return_storage_ptr__);
  while( true ) {
    local_28 = from((Node *)tn);
    if (local_28 != (TransformNode *)0x0) {
      matrix(&local_b0,local_28);
      memcpy(&local_f8,__return_storage_ptr__,0x44);
      o.m[2] = (float)(undefined4)uStack_f0;
      o.m[3] = (float)uStack_f0._4_4_;
      o.m[0] = (float)(undefined4)local_f8;
      o.m[1] = (float)local_f8._4_4_;
      o.m[4] = (float)(undefined4)local_e8;
      o.m[5] = (float)local_e8._4_4_;
      o.m[6] = (float)(undefined4)uStack_e0;
      o.m[7] = (float)uStack_e0._4_4_;
      o.m[8] = (float)(undefined4)local_d8;
      o.m[9] = (float)local_d8._4_4_;
      o.m[10] = (float)(undefined4)uStack_d0;
      o.m[0xb] = (float)uStack_d0._4_4_;
      o.m[0xc] = (float)(undefined4)local_c8;
      o.m[0xd] = (float)local_c8._4_4_;
      o.m[0xe] = (float)(undefined4)uStack_c0;
      o.m[0xf] = (float)uStack_c0._4_4_;
      o.type = local_b8;
      mat4::operator*(&local_6c,&local_b0,o);
      memcpy(__return_storage_ptr__,&local_6c,0x44);
    }
    if ((Node *)tn == n) break;
    tn = (TransformNode *)Node::parent((Node *)tn);
    if (n != (Node *)0x0 && (Node *)tn == (Node *)0x0) {
      __assert_fail("root == nullptr || n != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                    ,0x188,"static mat4 rengine::TransformNode::matrixFor(Node *, Node *)");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static mat4 matrixFor(Node *descendant, Node *root = 0) {
        Node *n = descendant;
        mat4 m;
        while (true) {
            if (TransformNode *tn = TransformNode::from(n)) {
                m = tn->matrix() * m;
            }
            if (n == root)
                break;
            n = n->parent();
            assert(root == nullptr || n != nullptr);
        }
        return m;
    }